

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_wrapper.hpp
# Opt level: O3

PyObject *
boost::python::objects::
class_cref_wrapper<GlobalStimulationSettings,_boost::python::objects::make_instance<GlobalStimulationSettings,_boost::python::objects::value_holder<GlobalStimulationSettings>_>_>
::convert(GlobalStimulationSettings *x)

{
  long lVar1;
  _object *p_Var2;
  decref_guard protect;
  decref_guard local_20;
  
  lVar1 = converter::registration::get_class_object
                    (converter::detail::registered_base<GlobalStimulationSettings_const_volatile&>::
                     converters);
  if (lVar1 == 0) {
    p_Var2 = (_object *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  else {
    p_Var2 = (_object *)(**(code **)(lVar1 + 0x130))(lVar1,0x28);
    if (p_Var2 == (_object *)0x0) {
      p_Var2 = (_object *)0x0;
    }
    else {
      local_20.obj = p_Var2;
      instance_holder::instance_holder((instance_holder *)(p_Var2 + 3));
      p_Var2[3].ob_refcnt = (Py_ssize_t)&PTR__value_holder_003ecce8;
      p_Var2[4].ob_refcnt = (Py_ssize_t)&PTR__NetworkDataType_003ec1a8;
      p_Var2[4].ob_type = *(PyTypeObject **)&x->scaleValue;
      *(bool *)&p_Var2[5].ob_refcnt = x->use_DC_amp;
      instance_holder::install((instance_holder *)(p_Var2 + 3),p_Var2);
      p_Var2[1].ob_refcnt = 0x30;
      local_20.obj = (PyObject *)0x0;
      python::detail::decref_guard::~decref_guard(&local_20);
    }
  }
  return p_Var2;
}

Assistant:

static PyObject* convert(Src const& x)
    {
        return MakeInstance::execute(boost::ref(x));
    }